

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

void __thiscall XMLElement::XMLElement(XMLElement *this,SymbolContext<char> *ctx)

{
  _Rb_tree_header *p_Var1;
  string *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__args;
  XMLElementBody *old;
  int i;
  long lVar2;
  
  p_Var1 = &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_body).m_content._M_dataplus._M_p = (pointer)&(this->m_body).m_content.field_2;
  (this->m_body).m_content._M_string_length = 0;
  (this->m_body).m_content.field_2._M_local_buf[0] = '\0';
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (string *)*ctx->values;
  std::__cxx11::string::operator=((string *)this,this_00);
  std::__cxx11::string::~string(this_00);
  operator_delete(this_00);
  lVar2 = 2;
  while( true ) {
    if (ctx->num_values <= lVar2) break;
    __args = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)ctx->values[lVar2 + -1];
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->m_attributes,__args);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(__args);
    operator_delete(__args);
    lVar2 = lVar2 + 1;
  }
  old = (XMLElementBody *)ctx->values[(long)ctx->num_values + -1];
  XMLElementBody::operator=(&this->m_body,old);
  XMLElementBody::~XMLElementBody(old);
  operator_delete(old);
  return;
}

Assistant:

XMLElement(const SymbolContext<char>& ctx)
    {
        std::string *name_str = ctx.value<std::string>(1);
        m_name = std::move(*name_str);
        delete name_str;
        for (int i = 2; i <= ctx.count() - 1; i++)
        {
            XMLAttribute *attr = ctx.value<XMLAttribute>(i);
            m_attributes.insert(*attr);
            delete attr;
        }
        XMLElementBody *body_ptr = ctx.value<XMLElementBody>(ctx.count());
        m_body = std::move(*body_ptr);
        delete body_ptr;
    }